

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::GatherBase::Run(GatherBase *this)

{
  CallLogWrapper *this_00;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  bool *compile_error;
  int iVar6;
  GLenum drawBuffer;
  char *local_98 [4];
  char *local_78 [4];
  GLfloat colorf [4];
  Vec4 buffData;
  
  iVar3 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x24])();
  iVar6 = 0;
  if ((char)iVar3 == '\0') {
    lVar5 = 0;
  }
  else {
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1e])(this);
    this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->fbo);
    glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&this->rbo);
    glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,this->rbo);
    glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,0x8058,1,1);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->fbo);
    glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,this->rbo);
    drawBuffer = 0x8ce0;
    glu::CallLogWrapper::glDrawBuffers(this_00,1,&drawBuffer);
    colorf[0] = 0.0;
    colorf[1] = 0.0;
    colorf[2] = 0.0;
    colorf[3] = 0.0;
    glu::CallLogWrapper::glClearBufferfv(this_00,0x1800,0,colorf);
    glu::CallLogWrapper::glViewport(this_00,0,0,1,1);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->vbo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->vbo);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])(&buffData,this);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x10,&buffData,0x88e4);
    do {
      if (iVar6 == 0) {
        (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1b])
                  ((string *)local_78,this);
        pcVar1 = local_78[0];
        (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x14])
                  ((string *)local_98,this);
        GVar4 = TGBase::CreateProgram(&this->super_TGBase,pcVar1,local_98[0]);
      }
      else {
        if (iVar6 == 2) {
          iVar3 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x25])
                            (this);
          return CONCAT44(extraout_var_00,iVar3);
        }
        (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
                  ((string *)local_78,this);
        pcVar1 = local_78[0];
        (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1c])
                  ((string *)local_98,this);
        GVar4 = TGBase::CreateProgram(&this->super_TGBase,pcVar1,local_98[0]);
      }
      this->program = GVar4;
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)local_78);
      glu::CallLogWrapper::glBindAttribLocation(this_00,this->program,0,"v_in_0");
      glu::CallLogWrapper::glLinkProgram(this_00,this->program);
      bVar2 = TGBase::CheckProgram(&this->super_TGBase,this->program,compile_error);
      if (!bVar2) break;
      glu::CallLogWrapper::glUseProgram(this_00,this->program);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      glu::CallLogWrapper::glReadBuffer(this_00,0x8ce0);
      glu::CallLogWrapper::glDeleteProgram(this_00,this->program);
      iVar3 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1f])(this);
      iVar6 = iVar6 + 1;
    } while (CONCAT44(extraout_var,iVar3) != -1);
    lVar5 = -1;
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		if (!Supported())
			return NO_ERROR;
		Init();

		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &rbo);
		glBindRenderbuffer(GL_RENDERBUFFER, rbo);
		glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, 1, 1);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
		GLenum drawBuffer = GL_COLOR_ATTACHMENT0;
		glDrawBuffers(1, &drawBuffer);
		GLfloat colorf[4] = { 0, 0, 0, 0 };
		glClearBufferfv(GL_COLOR, 0, colorf);
		glViewport(0, 0, 1, 1);

		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		glVertexAttribPointer(0, 4, GL_FLOAT, false, 0, 0);
		glEnableVertexAttribArray(0);
		Vec4 buffData = BufferData();
		glBufferData(GL_ARRAY_BUFFER, 16, &buffData, GL_STATIC_DRAW);

		for (int i = 0; i < 2; ++i)
		{
			if (i == 0)
				program = CreateProgram(VertexShader().c_str(), FallthroughFragmentShader().c_str());
			else
				program = CreateProgram(FallthroughVertexShader().c_str(), FragmentShader().c_str());
			glBindAttribLocation(program, 0, "v_in_0");
			glLinkProgram(program);
			if (!CheckProgram(program))
				return ERROR;
			glUseProgram(program);

			glDrawArrays(GL_POINTS, 0, 1);
			glReadBuffer(GL_COLOR_ATTACHMENT0);

			glDeleteProgram(program);

			if (Verify() == ERROR)
				return ERROR;
		}

		return TestCompute();
	}